

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O3

SelectorSyntax * __thiscall slang::parsing::Parser::parseElementSelector(Parser *this)

{
  TokenKind TVar1;
  ExpressionSyntax *expr;
  ExpressionSyntax *right;
  RangeSelectSyntax *pRVar2;
  BitSelectSyntax *pBVar3;
  SyntaxKind kind;
  Token TVar4;
  Token range;
  
  TVar4 = ParserBase::peek(&this->super_ParserBase);
  if (TVar4.kind == CloseBracket) {
    return (SelectorSyntax *)0x0;
  }
  expr = parseSubExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0,0);
  TVar4 = ParserBase::peek(&this->super_ParserBase);
  TVar1 = TVar4.kind;
  if (TVar1 == MinusColon) {
    range = ParserBase::consume(&this->super_ParserBase);
    right = parseSubExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0,0);
    kind = DescendingRangeSelect;
  }
  else if (TVar1 == PlusColon) {
    range = ParserBase::consume(&this->super_ParserBase);
    right = parseSubExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0,0);
    kind = AscendingRangeSelect;
  }
  else {
    if (TVar1 != Colon) {
      pBVar3 = slang::syntax::SyntaxFactory::bitSelect(&this->factory,expr);
      return &pBVar3->super_SelectorSyntax;
    }
    range = ParserBase::consume(&this->super_ParserBase);
    right = parseSubExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0,0);
    kind = SimpleRangeSelect;
  }
  pRVar2 = slang::syntax::SyntaxFactory::rangeSelect(&this->factory,kind,expr,range,right);
  return &pRVar2->super_SelectorSyntax;
}

Assistant:

SelectorSyntax* Parser::parseElementSelector() {
    if (peek().kind == TokenKind::CloseBracket) {
        return nullptr;
    }
    auto& expr = parseExpression();
    switch (peek().kind) {
        case TokenKind::Colon: {
            auto range = consume();
            return &factory.rangeSelect(SyntaxKind::SimpleRangeSelect, expr, range,
                                        parseExpression());
        }
        case TokenKind::PlusColon: {
            auto range = consume();
            return &factory.rangeSelect(SyntaxKind::AscendingRangeSelect, expr, range,
                                        parseExpression());
        }
        case TokenKind::MinusColon: {
            auto range = consume();
            return &factory.rangeSelect(SyntaxKind::DescendingRangeSelect, expr, range,
                                        parseExpression());
        }
        default:
            return &factory.bitSelect(expr);
    }
}